

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O1

void __thiscall
VariantMoveTest_move_ctor_set_C_Test::~VariantMoveTest_move_ctor_set_C_Test
          (VariantMoveTest_move_ctor_set_C_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VariantMoveTest, move_ctor_set_C) {
    {
        Variant<A, B, C> v1{};
        v1.set(C());

        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(move_ctor_count, 1);
        EXPECT_EQ(dtor_count, 1);

        auto v2 = std::move(v1);

        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(move_ctor_count, 2);
        EXPECT_EQ(dtor_count, 1);
    }
    EXPECT_EQ(ctor_count, 1);
    EXPECT_EQ(move_ctor_count, 2);
    EXPECT_EQ(dtor_count, 3);
}